

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O3

ostream * tchecker::operator<<(ostream *os,expression_type_t type)

{
  runtime_error *this;
  long lVar1;
  char *pcVar2;
  
  switch(type) {
  case EXPR_TYPE_BAD:
    pcVar2 = "BAD";
    lVar1 = 3;
    break;
  case EXPR_TYPE_INTTERM:
    pcVar2 = "INTTERM";
    goto LAB_0018d2a0;
  case EXPR_TYPE_INTVAR:
    pcVar2 = "INTVAR";
    goto LAB_0018d284;
  case EXPR_TYPE_INTARRAY:
    pcVar2 = "INTARRAY";
    goto LAB_0018d292;
  case EXPR_TYPE_LOCALINTVAR:
    pcVar2 = "LOCALINTVAR";
    lVar1 = 0xb;
    break;
  case EXPR_TYPE_LOCALINTARRAY:
    pcVar2 = "LOCALINTARRAY";
    lVar1 = 0xd;
    break;
  case EXPR_TYPE_INTLVALUE:
    pcVar2 = "INTLVALUE";
    goto LAB_0018d2ae;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"incomplete switch statement");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case EXPR_TYPE_CLKVAR:
    pcVar2 = "CLKVAR";
LAB_0018d284:
    lVar1 = 6;
    break;
  case EXPR_TYPE_CLKARRAY:
    pcVar2 = "CLKARRAY";
LAB_0018d292:
    lVar1 = 8;
    break;
  case EXPR_TYPE_CLKLVALUE:
    pcVar2 = "CLKLVALUE";
    goto LAB_0018d2ae;
  case EXPR_TYPE_CLKDIFF:
    pcVar2 = "CLKDIFF";
LAB_0018d2a0:
    lVar1 = 7;
    break;
  case EXPR_TYPE_INTCLKSUM:
    pcVar2 = "INTCLKSUM";
LAB_0018d2ae:
    lVar1 = 9;
    break;
  case EXPR_TYPE_ATOMIC_PREDICATE:
    pcVar2 = "ATOMIC_PREDICATE";
    goto LAB_0018d235;
  case EXPR_TYPE_CLKCONSTR_SIMPLE:
    pcVar2 = "CLKCONSTR_SIMPLE";
LAB_0018d235:
    lVar1 = 0x10;
    break;
  case EXPR_TYPE_CLKCONSTR_DIAGONAL:
    pcVar2 = "CLKCONSTR_DIAGONAL";
    lVar1 = 0x12;
    break;
  case EXPR_TYPE_CONJUNCTIVE_FORMULA:
    pcVar2 = "CONJUNCTIVE_FORMULA";
    lVar1 = 0x13;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, enum tchecker::expression_type_t type)
{
  switch (type) {
  case EXPR_TYPE_BAD:
    return os << "BAD";
  case EXPR_TYPE_INTTERM:
    return os << "INTTERM";
  case EXPR_TYPE_INTVAR:
    return os << "INTVAR";
  case EXPR_TYPE_INTARRAY:
    return os << "INTARRAY";
  case EXPR_TYPE_LOCALINTVAR:
    return os << "LOCALINTVAR";
  case EXPR_TYPE_LOCALINTARRAY:
    return os << "LOCALINTARRAY";
  case EXPR_TYPE_INTLVALUE:
    return os << "INTLVALUE";
  case EXPR_TYPE_CLKVAR:
    return os << "CLKVAR";
  case EXPR_TYPE_CLKARRAY:
    return os << "CLKARRAY";
  case EXPR_TYPE_CLKLVALUE:
    return os << "CLKLVALUE";
  case EXPR_TYPE_CLKDIFF:
    return os << "CLKDIFF";
  case EXPR_TYPE_INTCLKSUM:
    return os << "INTCLKSUM";
  case EXPR_TYPE_ATOMIC_PREDICATE:
    return os << "ATOMIC_PREDICATE";
  case EXPR_TYPE_CLKCONSTR_SIMPLE:
    return os << "CLKCONSTR_SIMPLE";
  case EXPR_TYPE_CLKCONSTR_DIAGONAL:
    return os << "CLKCONSTR_DIAGONAL";
  case EXPR_TYPE_CONJUNCTIVE_FORMULA:
    return os << "CONJUNCTIVE_FORMULA";
  default:
    throw std::runtime_error("incomplete switch statement");
  }
}